

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

ostream * glu::decl::operator<<(ostream *str,DeclareStructTypePtr *decl)

{
  ostream *poVar1;
  StructType *pSVar2;
  char *pcVar3;
  pointer pSVar4;
  allocator<char> local_91;
  string local_90;
  DeclareVariable local_70;
  
  std::operator<<(str,"struct");
  if ((decl->structPtr->m_typeName)._M_string_length != 0) {
    poVar1 = std::operator<<(str," ");
    pcVar3 = (char *)(decl->structPtr->m_typeName)._M_string_length;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (decl->structPtr->m_typeName)._M_dataplus._M_p;
    }
    std::operator<<(poVar1,pcVar3);
  }
  poVar1 = std::operator<<(str,"\n");
  local_70.varType.m_type = decl->indentLevel;
  operator<<(poVar1,(Indent *)&local_70);
  std::operator<<(poVar1,"{\n");
  pSVar2 = decl->structPtr;
  for (pSVar4 = (pSVar2->m_members).
                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar4 != (pSVar2->m_members).
                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
    local_70.varType.m_type = decl->indentLevel + TYPE_ARRAY;
    operator<<(str,(Indent *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(pSVar4->m_name)._M_dataplus._M_p,&local_91);
    DeclareVariable::DeclareVariable(&local_70,&pSVar4->m_type,&local_90,decl->indentLevel + 1);
    operator<<(str,&local_70);
    std::operator<<(str,";\n");
    DeclareVariable::~DeclareVariable(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pSVar2 = decl->structPtr;
  }
  local_70.varType.m_type = decl->indentLevel;
  operator<<(str,(Indent *)&local_70);
  std::operator<<(str,"}");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DeclareStructTypePtr& decl)
{
	str << "struct";

	// Type name is optional.
	if (decl.structPtr->hasTypeName())
		str << " " << decl.structPtr->getTypeName();

	str << "\n" << indent(decl.indentLevel) << "{\n";

	for (StructType::ConstIterator memberIter = decl.structPtr->begin(); memberIter != decl.structPtr->end(); memberIter++)
	{
		str << indent(decl.indentLevel+1);
		str << declare(memberIter->getType(), memberIter->getName(), decl.indentLevel+1) << ";\n";
	}

	str << indent(decl.indentLevel) << "}";

	return str;
}